

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O3

Remotes * Omega_h::form_down_use_owners
                    (Remotes *__return_storage_ptr__,Mesh *mesh,Int high_dim,Int low_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this;
  bool bVar3;
  LOs uses2lows;
  Remotes lows2owners;
  LOs local_a0;
  Remotes local_90;
  Alloc *local_70;
  void *local_68;
  Adj local_60;
  
  Mesh::ask_down(&local_60,mesh,high_dim,low_dim);
  local_a0.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_70 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  local_68 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    local_70 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  this = local_70;
  local_60.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&local_60);
  Mesh::ask_owners((Remotes *)&local_60,mesh,low_dim);
  bVar3 = ((ulong)this & 7) == 0;
  local_a0.write_.shared_alloc_.alloc = this;
  if (bVar3 && this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
    }
    else {
      this->use_count = this->use_count + 1;
    }
  }
  local_90.ranks.write_.shared_alloc_.alloc = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.ranks.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_90.idxs.write_.shared_alloc_.alloc = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.idxs.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  unmap(__return_storage_ptr__,&local_a0,&local_90);
  pAVar2 = local_90.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_90.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_90.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_90.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (bVar3 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Remotes form_down_use_owners(Mesh* mesh, Int high_dim, Int low_dim) {
  auto uses2lows = mesh->ask_down(high_dim, low_dim).ab2b;
  auto lows2owners = mesh->ask_owners(low_dim);
  return unmap(uses2lows, lows2owners);
}